

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::LargeObjectHeader::SetAttributes(LargeObjectHeader *this,uint cookie,uchar attributes)

{
  uchar uVar1;
  ushort uVar2;
  LargeObjectHeader *decodedNext_00;
  ushort newAttributeWithCheckSum;
  uchar newCheckSumValue;
  LargeObjectHeader *decodedNext;
  uchar attributes_local;
  uint cookie_local;
  LargeObjectHeader *this_local;
  
  decodedNext_00 = DecodeNext(this,cookie,this->next);
  uVar1 = CalculateCheckSum(this,decodedNext_00,attributes);
  uVar2 = EncodeAttributesAndChecksum(this,cookie,CONCAT11(attributes,uVar1));
  this->attributesAndChecksum = uVar2;
  return;
}

Assistant:

void
LargeObjectHeader::SetAttributes(uint cookie, unsigned char attributes)
{
#ifdef LARGEHEAPBLOCK_ENCODING
    LargeObjectHeader *decodedNext = this->DecodeNext(cookie, this->next);

    // Calculate the checksum value with new attribute
    unsigned char newCheckSumValue = this->CalculateCheckSum(decodedNext, attributes);
    // pack the (attribute + checksum)
    ushort newAttributeWithCheckSum = ((ushort)attributes << 8) | newCheckSumValue;
    // encode the packed (attribute + checksum) and set it
    this->attributesAndChecksum = this->EncodeAttributesAndChecksum(cookie, newAttributeWithCheckSum);
#else
    this->attributes = attributes;
#endif
}